

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_oram.h
# Opt level: O3

int __thiscall PathOram::access(PathOram *this,char *__name,int __type)

{
  uniform_int_distribution<int> *__param;
  int path;
  bool bVar1;
  result_type rVar2;
  undefined7 extraout_var;
  int pos;
  
  pos = (int)__name;
  path = (this->super_TreeOram).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[pos];
  bVar1 = TreeOram::readAndRemove(&this->super_TreeOram,pos);
  Bucket<int>::add((this->super_TreeOram).stash,pos);
  __param = &(this->super_TreeOram).uni;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (__param,&(this->super_TreeOram).rg,&__param->_M_param);
  (this->super_TreeOram).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[pos] = rVar2;
  flush(this,path);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool access(int identifier)
      {
         int old_pos = index[identifier];
         bool res = readAndRemove(identifier);
         stash->add(identifier);
         update_pos(identifier);
         flush(old_pos);
         return res;
      }